

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_zstd.c
# Opt level: O1

int zstd_filter_close(archive_read_filter *self)

{
  undefined8 *__ptr;
  
  __ptr = (undefined8 *)self->data;
  ZSTD_freeDStream(*__ptr);
  free((void *)__ptr[1]);
  free(__ptr);
  return 0;
}

Assistant:

static int
zstd_filter_close(struct archive_read_filter *self)
{
	struct private_data *state;

	state = (struct private_data *)self->data;

	ZSTD_freeDStream(state->dstream);
	free(state->out_block);
	free(state);

	return (ARCHIVE_OK);
}